

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::~Array
          (Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *this)

{
  MethodText *pMVar1;
  size_t sVar2;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (MethodText *)0x0) {
    sVar2 = this->size_;
    this->ptr = (MethodText *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pMVar1,0x118,sVar2,sVar2,
               ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::
               destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }